

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_8f392b::HandleSetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *this;
  NormalizeOption NVar3;
  int iVar4;
  string_view value;
  cmCMakePath path;
  allocator<char> local_99;
  path local_98;
  path local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((long)(args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 5U <
      0xfffffffffffffffe) {
    local_98._M_pathname._M_dataplus._M_p = (pointer)&local_98._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"SET must be called with two or three arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else if (pbVar1[1]._M_string_length == 0) {
    local_98._M_pathname._M_dataplus._M_p = (pointer)&local_98._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Invalid name for path variable.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (((anonymous_namespace)::
         HandleSetCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::parser == '\0') &&
       (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleSetCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser), iVar4 != 0)) {
      NormalizeParser::NormalizeParser(&HandleSetCommand::parser);
      __cxa_atexit(CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::
                   ~CMakePathArgumentParser,&HandleSetCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleSetCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
    NVar3 = CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::Parse<2>
                      (&HandleSetCommand::parser.
                        super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>,args);
    if ((long)HandleSetCommand::parser.
              super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)HandleSetCommand::parser.
              super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      pcVar2 = ((HandleSetCommand::parser.
                 super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,
                 pcVar2 + (HandleSetCommand::parser.
                           super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.
                           Inputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                ((cmCMakePath *)&local_98,&local_48,native_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((NVar3.Normalize & 1U) != 0) {
        cmCMakePath::Normal((cmCMakePath *)&local_70,(cmCMakePath *)&local_98);
        cmCMakePath::operator=((cmCMakePath *)&local_98,(cmCMakePath *)&local_70);
        std::filesystem::__cxx11::path::~path(&local_70);
      }
      this = status->Makefile;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::filesystem::__cxx11::path::
      generic_string<char,std::char_traits<char>,std::allocator<char>>
                (&local_70._M_pathname,&local_98,&local_99);
      value._M_str = local_70._M_pathname._M_dataplus._M_p;
      value._M_len = local_70._M_pathname._M_string_length;
      cmMakefile::AddDefinition(this,pbVar1 + 1,value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_pathname._M_dataplus._M_p != &local_70._M_pathname.field_2) {
        operator_delete(local_70._M_pathname._M_dataplus._M_p,
                        local_70._M_pathname.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_98);
      return true;
    }
    local_98._M_pathname._M_dataplus._M_p = (pointer)&local_98._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"SET called with unexpected arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_pathname._M_dataplus._M_p != &local_98._M_pathname.field_2) {
    operator_delete(local_98._M_pathname._M_dataplus._M_p,
                    local_98._M_pathname.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool HandleSetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() < 3 || args.size() > 4) {
    status.SetError("SET must be called with two or three arguments.");
    return false;
  }

  if (args[1].empty()) {
    status.SetError("Invalid name for path variable.");
    return false;
  }

  static NormalizeParser const parser;

  const auto arguments = parser.Parse(args);

  if (parser.GetInputs().size() != 1) {
    status.SetError("SET called with unexpected arguments.");
    return false;
  }

  auto path =
    cmCMakePath(parser.GetInputs().front(), cmCMakePath::native_format);

  if (arguments.Normalize) {
    path = path.Normal();
  }

  status.GetMakefile().AddDefinition(args[1], path.GenericString());

  return true;
}